

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotText(char *text,double x,double y,bool vertical,ImVec2 *pixel_offset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImU32 col;
  ImDrawList *this;
  ImVec4 IVar7;
  ImVec2 pos;
  float local_78;
  float fStack_74;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  ImVec2 local_38;
  
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    this = GetPlotDrawList();
    PushPlotClipRect(0.0);
    fVar1 = (GImPlot->Style).Colors[0xc].w;
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      fVar1 = (GImPlot->Style).Colors[0xc].x;
      fVar3 = (GImPlot->Style).Colors[0xc].y;
      fVar2 = (GImPlot->Style).Colors[0xc].z;
      fVar4 = (GImPlot->Style).Colors[0xc].w;
    }
    else {
      IVar7 = GetAutoColor(0xc);
      fVar2 = IVar7.z;
      fVar4 = IVar7.w;
      fVar1 = IVar7.x;
      fVar3 = IVar7.y;
    }
    local_68 = (double)CONCAT44(fVar3,fVar1);
    uStack_60 = (double)CONCAT44(fVar4,fVar2);
    col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&local_68);
    if (vertical) {
      IVar5 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_58 = IVar5.y;
      local_48 = IVar5.x * 0.5;
      local_68 = x;
      uStack_60 = y;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_58;
      IVar6 = PlotToPixels((ImPlotPoint *)&local_68,-1);
      IVar5.y = IVar6.y + local_48 + pixel_offset->y;
      IVar5.x = (IVar6.x - local_58 * 0.5) + pixel_offset->x;
      AddTextVertical(this,IVar5,col,text,(char *)0x0);
    }
    else {
      local_68 = x;
      uStack_60 = y;
      IVar5 = PlotToPixels((ImPlotPoint *)&local_68,-1);
      IVar6 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_78 = IVar5.x;
      fStack_74 = IVar5.y;
      local_38.y = (fStack_74 - IVar6.y * 0.5) + pixel_offset->y;
      local_38.x = (local_78 - IVar6.x * 0.5) + pixel_offset->x;
      ImDrawList::AddText(this,&local_38,col,text,(char *)0x0);
    }
    PopPlotClipRect();
    return;
  }
  __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotText() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                ,0x8b9,"void ImPlot::PlotText(const char *, double, double, bool, const ImVec2 &)");
}

Assistant:

void PlotText(const char* text, double x, double y, bool vertical, const ImVec2& pixel_offset) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotText() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    ImU32 colTxt = GetStyleColorU32(ImPlotCol_InlayText);
    if (vertical) {
        ImVec2 ctr = CalcTextSizeVertical(text) * 0.5f;
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) + ImVec2(-ctr.x, ctr.y) + pixel_offset;
        AddTextVertical(&DrawList, pos, colTxt, text);
    }
    else {
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) - ImGui::CalcTextSize(text) * 0.5f + pixel_offset;
        DrawList.AddText(pos, colTxt, text);
    }
    PopPlotClipRect();
}